

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

TimingControl * __thiscall slang::ast::ClockingBlockSymbol::getEvent(ClockingBlockSymbol *this)

{
  Symbol *symbol;
  SyntaxNode *this_00;
  TimingControl *pTVar2;
  bitmask<slang::ast::ASTFlags> in_RDI;
  LookupLocation LVar3;
  ASTContext context;
  SyntaxNode *syntax;
  Scope *scope;
  ASTContext *in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff88;
  Scope *pSVar1;
  
  if (((Symbol *)(in_RDI.m_bits + 0x40))->originatingSyntax == (SyntaxNode *)0x0) {
    symbol = (Symbol *)Symbol::getParentScope((Symbol *)in_RDI.m_bits);
    this_00 = Symbol::getSyntax((Symbol *)in_RDI.m_bits);
    LVar3 = LookupLocation::before(symbol);
    pSVar1 = LVar3.scope;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff88,None);
    LVar3._8_8_ = pSVar1;
    LVar3.scope = (Scope *)in_stack_ffffffffffffff88.m_bits;
    ASTContext::ASTContext(in_stack_ffffffffffffff78,(Scope *)symbol,LVar3,in_RDI);
    Scope::getCompilation((Scope *)(in_RDI.m_bits + 0x40));
    slang::syntax::SyntaxNode::as<slang::syntax::ClockingDeclarationSyntax>(this_00);
    not_null<slang::syntax::EventExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::EventExpressionSyntax_*> *)0x72b6b9);
    pTVar2 = EventListControl::fromSyntax
                       ((Compilation *)context.flags.m_bits,(SyntaxNode *)context._8_8_,
                        (ASTContext *)context.scope.ptr);
    ((Symbol *)(in_RDI.m_bits + 0x40))->originatingSyntax = (SyntaxNode *)pTVar2;
  }
  return (TimingControl *)((Symbol *)(in_RDI.m_bits + 0x40))->originatingSyntax;
}

Assistant:

const TimingControl& ClockingBlockSymbol::getEvent() const {
    if (!event) {
        auto scope = getParentScope();
        auto syntax = getSyntax();
        SLANG_ASSERT(scope && syntax);

        ASTContext context(*scope, LookupLocation::before(*this));
        event = &EventListControl::fromSyntax(getCompilation(),
                                              *syntax->as<ClockingDeclarationSyntax>().event,
                                              context);
    }
    return *event;
}